

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O1

void __thiscall
NewSymbolTreeVisitor::PreVisit(NewSymbolTreeVisitor *this,VariableDeclaration *variable_declaration)

{
  symbol_table_t *this_00;
  member_table_t *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  Type *pTVar3;
  __hashtable *__h;
  _Hashtable<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_02;
  iterator iVar4;
  mapped_type *pmVar5;
  _Hashtable<Symbol,_Symbol,_std::allocator<Symbol>,_std::__detail::_Identity,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_03;
  iterator iVar6;
  _Map_base<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_04;
  mapped_type *pmVar7;
  runtime_error *prVar8;
  long *plVar9;
  PrimitiveSimpleObject *pPVar10;
  size_type *psVar11;
  Symbol *__k;
  Type **__args;
  __node_gen_type __node_gen;
  Symbol symbol;
  undefined1 local_138 [32];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveArrayObject>_>
  local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  Symbol local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  pcVar2 = (variable_declaration->variable_name_)._M_dataplus._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar2,
             pcVar2 + (variable_declaration->variable_name_)._M_string_length);
  Symbol::Symbol(&local_a8,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  __args = &variable_declaration->type_;
  this_00 = &(this->tree_).class_symbols_table_;
  __k = &this->current_layer_->class_symbol_;
  if ((variable_declaration->type_->type_name_)._M_dataplus._M_p
      [(variable_declaration->type_->type_name_)._M_string_length - 1] == ']') {
    this_02 = (_Hashtable<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)std::__detail::_Map_base<$a1ab393$>::operator[]
                           ((_Map_base<_a1ab393_> *)this_00,__k);
    iVar4 = std::
            _Hashtable<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(this_02,&local_a8);
    std::__detail::_Map_base<$a1ab393$>::operator[]
              ((_Map_base<_a1ab393_> *)this_00,&this->current_layer_->class_symbol_);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      Symbol::GetName_abi_cxx11_(&local_88,&this->current_layer_->class_symbol_);
      std::operator+(&local_c8,"In class ",&local_88);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_e8._M_dataplus._M_p = (pointer)*plVar9;
      psVar11 = (size_type *)(plVar9 + 2);
      if ((size_type *)local_e8._M_dataplus._M_p == psVar11) {
        local_e8.field_2._M_allocated_capacity = *psVar11;
        local_e8.field_2._8_8_ = plVar9[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar11;
      }
      local_e8._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      Symbol::GetName_abi_cxx11_(&local_68,&local_a8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     &local_e8,&local_68);
      plVar9 = (long *)std::__cxx11::string::append(local_138);
      local_118.first._M_dataplus._M_p = (pointer)*plVar9;
      psVar11 = (size_type *)(plVar9 + 2);
      if ((size_type *)local_118.first._M_dataplus._M_p == psVar11) {
        local_118.first.field_2._M_allocated_capacity = *psVar11;
        local_118.first.field_2._8_8_ = plVar9[3];
        local_118.first._M_dataplus._M_p = (pointer)&local_118.first.field_2;
      }
      else {
        local_118.first.field_2._M_allocated_capacity = *psVar11;
      }
      local_118.first._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::runtime_error::runtime_error(prVar8,(string *)&local_118);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pTVar3 = *__args;
    if (pTVar3 == (Type *)0x0) {
      local_e8._M_dataplus._M_p = (pointer)0x0;
    }
    else {
      local_e8._M_dataplus._M_p =
           (pointer)__dynamic_cast(pTVar3,&Type::typeinfo,&ArrayType::typeinfo,0);
    }
    local_138._0_8_ = (PrimitiveSimpleObject *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<PrimitiveArrayObject,std::allocator<PrimitiveArrayObject>,ArrayType*>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8),
               (PrimitiveArrayObject **)local_138,(allocator<PrimitiveArrayObject> *)&local_c8,
               (ArrayType **)&local_e8);
    paVar1 = &local_118.first.field_2;
    pcVar2 = (pTVar3->type_name_)._M_dataplus._M_p;
    local_118.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar2,pcVar2 + (pTVar3->type_name_)._M_string_length);
    local_118.second.super___shared_ptr<PrimitiveArrayObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_138._0_8_;
    local_118.second.super___shared_ptr<PrimitiveArrayObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_;
    local_138._0_8_ = (PrimitiveSimpleObject *)0x0;
    local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_04 = (_Map_base<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)std::__detail::_Map_base<$a1ab393$>::operator[]
                           ((_Map_base<_a1ab393_> *)this_00,&this->current_layer_->class_symbol_);
    pmVar7 = std::__detail::
             _Map_base<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[](this_04,&local_a8);
    std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>::operator=
              ((pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>> *)pmVar7,&local_118);
    if (local_118.second.super___shared_ptr<PrimitiveArrayObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118.second.
                 super___shared_ptr<PrimitiveArrayObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.first._M_dataplus._M_p == paVar1) goto LAB_001165b9;
  }
  else {
    pmVar5 = std::__detail::_Map_base<$a1ab393$>::operator[]((_Map_base<_a1ab393_> *)this_00,__k);
    iVar4 = std::
            _Hashtable<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&(pmVar5->
                       super__Tuple_impl<0UL,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>
                       ).
                       super__Head_base<0UL,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_false>
                   ,&local_a8);
    std::__detail::_Map_base<$a1ab393$>::operator[]
              ((_Map_base<_a1ab393_> *)this_00,&this->current_layer_->class_symbol_);
    if (iVar4.
        super__Node_iterator_base<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      Symbol::GetName_abi_cxx11_(&local_88,&this->current_layer_->class_symbol_);
      std::operator+(&local_c8,"In class ",&local_88);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_e8._M_dataplus._M_p = (pointer)*plVar9;
      psVar11 = (size_type *)(plVar9 + 2);
      if ((size_type *)local_e8._M_dataplus._M_p == psVar11) {
        local_e8.field_2._M_allocated_capacity = *psVar11;
        local_e8.field_2._8_8_ = plVar9[3];
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar11;
      }
      local_e8._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      Symbol::GetName_abi_cxx11_(&local_68,&local_a8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     &local_e8,&local_68);
      plVar9 = (long *)std::__cxx11::string::append(local_138);
      local_118.first._M_dataplus._M_p = (pointer)*plVar9;
      psVar11 = (size_type *)(plVar9 + 2);
      if ((size_type *)local_118.first._M_dataplus._M_p == psVar11) {
        local_118.first.field_2._M_allocated_capacity = *psVar11;
        local_118.first.field_2._8_8_ = plVar9[3];
        local_118.first._M_dataplus._M_p = (pointer)&local_118.first.field_2;
      }
      else {
        local_118.first.field_2._M_allocated_capacity = *psVar11;
      }
      local_118.first._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::runtime_error::runtime_error(prVar8,(string *)&local_118);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pTVar3 = *__args;
    local_138._0_8_ = (PrimitiveSimpleObject *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<PrimitiveSimpleObject,std::allocator<PrimitiveSimpleObject>,Type*&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8),
               (PrimitiveSimpleObject **)local_138,(allocator<PrimitiveSimpleObject> *)&local_e8,
               __args);
    paVar1 = &local_118.first.field_2;
    pcVar2 = (pTVar3->type_name_)._M_dataplus._M_p;
    local_118.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,pcVar2,pcVar2 + (pTVar3->type_name_)._M_string_length);
    local_118.second.super___shared_ptr<PrimitiveArrayObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_138._0_8_;
    local_118.second.super___shared_ptr<PrimitiveArrayObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_;
    local_138._0_8_ = (PrimitiveSimpleObject *)0x0;
    local_138._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pmVar5 = std::__detail::_Map_base<$a1ab393$>::operator[]
                       ((_Map_base<_a1ab393_> *)this_00,&this->current_layer_->class_symbol_);
    pmVar7 = std::__detail::
             _Map_base<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(pmVar5->
                              super__Tuple_impl<0UL,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_std::unordered_map<Symbol,_std::shared_ptr<Method>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::shared_ptr<Method>_>_>_>,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>_>
                              ).
                              super__Head_base<0UL,_std::unordered_map<Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<std::pair<const_Symbol,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveObject>_>_>_>_>,_false>
                          ,&local_a8);
    std::pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>>::operator=
              ((pair<std::__cxx11::string,std::shared_ptr<PrimitiveObject>> *)pmVar7,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<PrimitiveSimpleObject>_>
                *)&local_118);
    if (local_118.second.super___shared_ptr<PrimitiveArrayObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_118.second.
                 super___shared_ptr<PrimitiveArrayObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118.first._M_dataplus._M_p == paVar1) goto LAB_001165b9;
  }
  operator_delete(local_118.first._M_dataplus._M_p,local_118.first.field_2._M_allocated_capacity + 1
                 );
LAB_001165b9:
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
  }
  this_01 = &(this->tree_).class_members_table_;
  this_03 = &std::__detail::
             _Map_base<Symbol,_std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>,_std::allocator<std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>,_std::allocator<std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this_01,&this->current_layer_->class_symbol_)->_M_h;
  iVar6 = std::
          _Hashtable<Symbol,_Symbol,_std::allocator<Symbol>,_std::__detail::_Identity,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(this_03,&local_a8);
  std::__detail::
  _Map_base<Symbol,_std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>,_std::allocator<std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>,_std::allocator<std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)this_01,&this->current_layer_->class_symbol_);
  if (iVar6.super__Node_iterator_base<Symbol,_true>._M_cur != (__node_type *)0x0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    Symbol::GetName_abi_cxx11_(&local_c8,&this->current_layer_->class_symbol_);
    std::operator+(&local_e8,"In class ",&local_c8);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_e8);
    local_138._0_8_ = *plVar9;
    pPVar10 = (PrimitiveSimpleObject *)(plVar9 + 2);
    if ((PrimitiveSimpleObject *)local_138._0_8_ == pPVar10) {
      local_138._16_8_ = (pPVar10->super_PrimitiveObject).super_Object._vptr_Object;
      local_138._24_8_ = plVar9[3];
      local_138._0_8_ = (PrimitiveSimpleObject *)(local_138 + 0x10);
    }
    else {
      local_138._16_8_ = (pPVar10->super_PrimitiveObject).super_Object._vptr_Object;
    }
    local_138._8_8_ = plVar9[1];
    *plVar9 = (long)pPVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    Symbol::GetName_abi_cxx11_(&local_88,&local_a8);
    std::operator+(&local_118.first,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                   &local_88);
    std::runtime_error::runtime_error(prVar8,(string *)&local_118);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_118.first._M_dataplus._M_p =
       (pointer)std::__detail::
                _Map_base<Symbol,_std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>,_std::allocator<std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>,_std::allocator<std::pair<const_Symbol,_std::unordered_set<Symbol,_std::hash<Symbol>,_std::equal_to<Symbol>,_std::allocator<Symbol>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_01,&this->current_layer_->class_symbol_);
  std::
  _Hashtable<Symbol,Symbol,std::allocator<Symbol>,std::__detail::_Identity,std::equal_to<Symbol>,std::hash<Symbol>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_insert<Symbol_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Symbol,true>>>>
            ((_Hashtable<Symbol,Symbol,std::allocator<Symbol>,std::__detail::_Identity,std::equal_to<Symbol>,std::hash<Symbol>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_118.first._M_dataplus._M_p,&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.name_._M_dataplus._M_p != &local_a8.name_.field_2) {
    operator_delete(local_a8.name_._M_dataplus._M_p,local_a8.name_.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void NewSymbolTreeVisitor::PreVisit(VariableDeclaration* variable_declaration) {
  Symbol symbol(variable_declaration->variable_name_);
  if (variable_declaration->type_->type_name_.back() != ']') {
    if (std::get<0>(tree_.class_symbols_table_[current_layer_->class_symbol_])
            .find(symbol) !=
        std::get<0>(tree_.class_symbols_table_[current_layer_->class_symbol_])
            .end()) {
      throw std::runtime_error(
          "In class " + current_layer_->class_symbol_.GetName() + " variable " +
          symbol.GetName() + " has been already declared!");
    }

    std::get<0>(
        tree_.class_symbols_table_[current_layer_->class_symbol_])[symbol] =
        std::make_pair(variable_declaration->type_->type_name_,
                       std::make_shared<PrimitiveSimpleObject>(variable_declaration->type_));
  } else {
    if (std::get<2>(tree_.class_symbols_table_[current_layer_->class_symbol_])
            .find(symbol) !=
        std::get<2>(tree_.class_symbols_table_[current_layer_->class_symbol_])
            .end()) {
      throw std::runtime_error(
          "In class " + current_layer_->class_symbol_.GetName() + " array " +
          symbol.GetName() + " has been already declared!");
    }

    std::get<2>(
        tree_.class_symbols_table_[current_layer_->class_symbol_])[symbol] =
        std::make_pair(variable_declaration->type_->type_name_,
                       std::make_shared<PrimitiveArrayObject>(dynamic_cast<ArrayType*>(variable_declaration->type_)));
  }

  if (tree_.class_members_table_[current_layer_->class_symbol_].find(symbol) !=
      tree_.class_members_table_[current_layer_->class_symbol_].end()) {
    throw std::runtime_error("In class " +
                             current_layer_->class_symbol_.GetName() +
                             " member duplicate: " + symbol.GetName());
  }
  tree_.class_members_table_[current_layer_->class_symbol_].insert(symbol);
}